

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

TSymbol * __thiscall glslang::TSymbolTable::find(TSymbolTable *this,TString *name,int *thisDepth)

{
  long lVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  TSymbolTableLevel *this_00;
  TSymbol *pTVar4;
  long lVar5;
  
  ppTVar2 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppTVar3 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *thisDepth = 0;
  lVar5 = (long)(int)((ulong)((long)ppTVar2 - (long)ppTVar3) >> 3);
  do {
    this_00 = (this->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar5 + -1];
    if (this_00->thisLevel == true) {
      *thisDepth = *thisDepth + 1;
    }
    pTVar4 = TSymbolTableLevel::find(this_00,name);
    lVar1 = lVar5 + -1;
  } while ((1 < lVar5) && (lVar5 = lVar1, pTVar4 == (TSymbol *)0x0));
  if ((this->table).
      super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar1]->thisLevel == false) {
    *thisDepth = 0;
  }
  return pTVar4;
}

Assistant:

TSymbol* find(const TString& name, int& thisDepth)
    {
        int level = currentLevel();
        TSymbol* symbol;
        thisDepth = 0;
        do {
            if (table[level]->isThisLevel())
                ++thisDepth;
            symbol = table[level]->find(name);
            --level;
        } while (symbol == nullptr && level >= 0);

        if (! table[level + 1]->isThisLevel())
            thisDepth = 0;

        return symbol;
    }